

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

int __thiscall nuraft::asio_rpc_listener::shutdown(asio_rpc_listener *this,int __fd,int __how)

{
  __shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  __shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ptr<rpc_session> s;
  __shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::mutex::lock(&this->session_lock_);
  p_Var1 = &((this->active_sessions_).
             super__Vector_base<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var3 = &((this->active_sessions_).
                  super__Vector_base<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>;
      p_Var3 != p_Var1; p_Var3 = p_Var3 + 1) {
    std::__shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,p_Var3);
    rpc_session::stop(local_40._M_ptr);
    std::__shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>::reset(&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  std::
  vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
  ::clear(&this->active_sessions_);
  pthread_mutex_unlock((pthread_mutex_t *)&this->session_lock_);
  std::mutex::lock(&this->listener_lock_);
  std::__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>);
  iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&this->listener_lock_);
  return iVar2;
}

Assistant:

virtual void shutdown() override {
        {
            auto_lock(session_lock_);
            for (auto& entry: active_sessions_) {
                ptr<rpc_session> s = entry;
                s->stop();
                s.reset();
            }
            active_sessions_.clear();
        }

        auto_lock(listener_lock_);
        handler_.reset();
    }